

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCharacterDataImpl.cpp
# Opt level: O2

XMLCh * __thiscall
xercesc_4_0::DOMCharacterDataImpl::substringData
          (DOMCharacterDataImpl *this,DOMNode *node,XMLSize_t offset,XMLSize_t count)

{
  ulong uVar1;
  int iVar2;
  undefined4 extraout_var;
  XMLCh *target;
  XMLCh *pXVar3;
  DOMException *this_00;
  MemoryManager **ppMVar4;
  DOMDocumentImpl *this_01;
  XMLCh temp [4096];
  undefined4 extraout_var_00;
  
  target = temp;
  uVar1 = this->fDataBuf->fIndex;
  if (uVar1 < offset) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this->fDoc == (DOMDocumentImpl *)0x0) {
      ppMVar4 = (MemoryManager **)&XMLPlatformUtils::fgMemoryManager;
    }
    else {
      ppMVar4 = &this->fDoc->fMemoryManager;
    }
    DOMException::DOMException(this_00,1,0,*ppMVar4);
    __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
  }
  iVar2 = (*node->_vptr_DOMNode[0xc])(node);
  this_01 = (DOMDocumentImpl *)(CONCAT44(extraout_var,iVar2) + -8);
  if (CONCAT44(extraout_var,iVar2) == 0) {
    this_01 = (DOMDocumentImpl *)0x0;
  }
  if (0xffe < uVar1) {
    iVar2 = (*this_01->fMemoryManager->_vptr_MemoryManager[3])
                      (this_01->fMemoryManager,uVar1 * 2 + 2);
    target = (XMLCh *)CONCAT44(extraout_var_00,iVar2);
  }
  pXVar3 = this->fDataBuf->fBuffer;
  pXVar3[this->fDataBuf->fIndex] = L'\0';
  XMLString::copyNString(target,pXVar3 + offset,count);
  target[count] = L'\0';
  pXVar3 = DOMDocumentImpl::getPooledString(this_01,target);
  if (0xffe < uVar1) {
    (*this_01->fMemoryManager->_vptr_MemoryManager[4])(this_01->fMemoryManager,target);
  }
  return pXVar3;
}

Assistant:

const XMLCh * DOMCharacterDataImpl::substringData(const DOMNode *node, XMLSize_t offset,
                                           XMLSize_t count) const
{

    // Note: the C++ XMLCh * operation throws the correct DOMExceptions
    //       when parameter values are bad.
    //


    XMLSize_t len = fDataBuf->getLen();

    if (offset > len)
        throw DOMException(DOMException::INDEX_SIZE_ERR, 0, GetDOMCharacterDataImplMemoryManager);

    DOMDocumentImpl *doc = (DOMDocumentImpl *)node->getOwnerDocument();

    XMLCh* newString;
    XMLCh temp[4096];
    if (len >= 4095)
      newString = (XMLCh*) doc->getMemoryManager()->allocate
        (
            (len + 1) * sizeof(XMLCh)
        );//new XMLCh[len+1];
    else
        newString = temp;

    XMLString::copyNString(newString, fDataBuf->getRawBuffer()+offset, count);
    newString[count] = chNull;

    const XMLCh* retString = doc->getPooledString(newString);

    if (len >= 4095)
      doc->getMemoryManager()->deallocate(newString);//delete[] newString;

    return retString;

}